

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::init
          (ShaderAtomicCompSwapCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  ShaderProgram *pSVar7;
  RenderContext *renderCtx;
  ProgramSources *sources;
  TestLog *log;
  TestError *this_00;
  char *pcVar8;
  bool bVar9;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d1;
  string local_2d0;
  ShaderSource local_2b0;
  ProgramSources local_288;
  undefined1 local_1a8 [8];
  ostringstream src;
  deUint32 numValues;
  char *typeName;
  char *precName;
  bool isSSBO;
  ShaderAtomicCompSwapCase *this_local;
  
  bVar9 = this->m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
  pcVar4 = glu::getPrecisionName(this->m_precision);
  pcVar5 = glu::getDataTypeName(this->m_type);
  uVar1 = product<unsigned_int,3>(&this->m_workGroupSize);
  uVar2 = product<unsigned_int,3>(&this->m_numWorkGroups);
  src._372_4_ = uVar1 * uVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar6 = std::operator<<((ostream *)local_1a8,"#version 310 es\n");
  poVar6 = std::operator<<(poVar6,"layout(local_size_x = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::x(&this->m_workGroupSize);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
  poVar6 = std::operator<<(poVar6,", local_size_y = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::y(&this->m_workGroupSize);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
  poVar6 = std::operator<<(poVar6,", local_size_z = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::z(&this->m_workGroupSize);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
  poVar6 = std::operator<<(poVar6,") in;\n");
  poVar6 = std::operator<<(poVar6,"layout(binding = 0) buffer InOut\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," compareValues[");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,src._372_4_);
  poVar6 = std::operator<<(poVar6,"];\n");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," exchangeValues[");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,src._372_4_);
  poVar6 = std::operator<<(poVar6,"];\n");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," outputValues[");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,src._372_4_);
  poVar6 = std::operator<<(poVar6,"];\n");
  poVar6 = std::operator<<(poVar6,"\t");
  pcVar8 = "";
  if (bVar9) {
    pcVar8 = "coherent ";
  }
  poVar6 = std::operator<<(poVar6,pcVar8);
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," groupValues[");
  uVar1 = product<unsigned_int,3>(&this->m_numWorkGroups);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
  poVar6 = std::operator<<(poVar6,"];\n");
  std::operator<<(poVar6,"} sb_inout;\n");
  if (!bVar9) {
    poVar6 = std::operator<<((ostream *)local_1a8,"shared ");
    poVar6 = std::operator<<(poVar6,pcVar4);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,pcVar5);
    std::operator<<(poVar6," s_var;\n");
  }
  poVar6 = std::operator<<((ostream *)local_1a8,"\n");
  poVar6 = std::operator<<(poVar6,"void main (void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,
                           "\tuint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar6 = std::operator<<(poVar6,
                           "\tuint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar6 = std::operator<<(poVar6,"\tuint globalOffs = localSize*globalNdx;\n");
  poVar6 = std::operator<<(poVar6,"\tuint offset     = globalOffs + gl_LocalInvocationIndex;\n");
  std::operator<<(poVar6,"\n");
  if (!bVar9) {
    poVar6 = std::operator<<((ostream *)local_1a8,"\tif (gl_LocalInvocationIndex == 0u)\n");
    poVar6 = std::operator<<(poVar6,"\t\ts_var = ");
    poVar6 = std::operator<<(poVar6,pcVar5);
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
    poVar6 = std::operator<<(poVar6,");\n");
    std::operator<<(poVar6,"\n");
  }
  poVar6 = std::operator<<((ostream *)local_1a8,"\t");
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," compare = sb_inout.compareValues[offset];\n");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," exchange = sb_inout.exchangeValues[offset];\n");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," result;\n");
  poVar6 = std::operator<<(poVar6,"\tbool swapDone = false;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\tfor (uint ndx = 0u; ndx < localSize; ndx++)\n");
  poVar6 = std::operator<<(poVar6,"\t{\n");
  poVar6 = std::operator<<(poVar6,"\t\tbarrier();\n");
  poVar6 = std::operator<<(poVar6,"\t\tif (!swapDone)\n");
  poVar6 = std::operator<<(poVar6,"\t\t{\n");
  poVar6 = std::operator<<(poVar6,"\t\t\tresult = atomicCompSwap(");
  pcVar4 = "s_var";
  if (bVar9) {
    pcVar4 = "sb_inout.groupValues[globalNdx]";
  }
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6,", compare, exchange);\n");
  poVar6 = std::operator<<(poVar6,"\t\t\tif (result == compare)\n");
  poVar6 = std::operator<<(poVar6,"\t\t\t\tswapDone = true;\n");
  poVar6 = std::operator<<(poVar6,"\t\t}\n");
  poVar6 = std::operator<<(poVar6,"\t}\n");
  poVar6 = std::operator<<(poVar6,"\n");
  std::operator<<(poVar6,"\tsb_inout.outputValues[offset] = result;\n");
  if (!bVar9) {
    poVar6 = std::operator<<((ostream *)local_1a8,"\tbarrier();\n");
    poVar6 = std::operator<<(poVar6,"\tif (gl_LocalInvocationIndex == 0u)\n");
    std::operator<<(poVar6,"\t\tsb_inout.groupValues[globalNdx] = s_var;\n");
  }
  std::operator<<((ostream *)local_1a8,"}\n");
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  local_2d1 = 1;
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_288);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_2b0,&local_2d0);
  sources = glu::ProgramSources::operator<<(&local_288,&local_2b0);
  glu::ShaderProgram::ShaderProgram(pSVar7,renderCtx,sources);
  local_2d1 = 0;
  this->m_program = pSVar7;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  glu::ProgramSources::~ProgramSources(&local_288);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,this->m_program);
  bVar9 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar9) {
    pSVar7 = this->m_program;
    if (pSVar7 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar7);
      operator_delete(pSVar7,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"Compile failed",&local_2f9);
    tcu::TestError::TestError(this_00,&local_2f8);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  iVar3 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return iVar3;
}

Assistant:

void ShaderAtomicCompSwapCase::init (void)
{
	const bool			isSSBO		= m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
	const char*			precName	= getPrecisionName(m_precision);
	const char*			typeName	= getDataTypeName(m_type);
	const deUint32		numValues	= product(m_workGroupSize)*product(m_numWorkGroups);
	std::ostringstream	src;

	src << "#version 310 es\n"
		<< "layout(local_size_x = " << m_workGroupSize.x()
		<< ", local_size_y = " << m_workGroupSize.y()
		<< ", local_size_z = " << m_workGroupSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut\n"
		<< "{\n"
		<< "	" << precName << " " << typeName << " compareValues[" << numValues << "];\n"
		<< "	" << precName << " " << typeName << " exchangeValues[" << numValues << "];\n"
		<< "	" << precName << " " << typeName << " outputValues[" << numValues << "];\n"
		<< "	" << (isSSBO ? "coherent " : "") << precName << " " << typeName << " groupValues[" << product(m_numWorkGroups) << "];\n"
		<< "} sb_inout;\n";

	if (!isSSBO)
		src << "shared " << precName << " " << typeName << " s_var;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "	uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "	uint globalOffs = localSize*globalNdx;\n"
		<< "	uint offset     = globalOffs + gl_LocalInvocationIndex;\n"
		<< "\n";

	if (!isSSBO)
	{
		src << "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		s_var = " << typeName << "(" << 0 << ");\n"
			<< "\n";
	}

	src << "	" << precName << " " << typeName << " compare = sb_inout.compareValues[offset];\n"
		<< "	" << precName << " " << typeName << " exchange = sb_inout.exchangeValues[offset];\n"
		<< "	" << precName << " " << typeName << " result;\n"
		<< "	bool swapDone = false;\n"
		<< "\n"
		<< "	for (uint ndx = 0u; ndx < localSize; ndx++)\n"
		<< "	{\n"
		<< "		barrier();\n"
		<< "		if (!swapDone)\n"
		<< "		{\n"
		<< "			result = atomicCompSwap(" << (isSSBO ? "sb_inout.groupValues[globalNdx]" : "s_var") << ", compare, exchange);\n"
		<< "			if (result == compare)\n"
		<< "				swapDone = true;\n"
		<< "		}\n"
		<< "	}\n"
		<< "\n"
		<< "	sb_inout.outputValues[offset] = result;\n";

	if (!isSSBO)
	{
		src << "	barrier();\n"
			<< "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		sb_inout.groupValues[globalNdx] = s_var;\n";
	}

	src << "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}